

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_bit_tohex(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  jit_State *in_RSI;
  jit_State *in_RDI;
  TRef tr;
  TRef hdr;
  TRef in_stack_00000034;
  RecordFFData *in_stack_00000038;
  jit_State *in_stack_00000040;
  
  TVar1 = recff_bufhdr(in_RSI);
  TVar2 = recff_bit64_tohex(in_stack_00000040,in_stack_00000038,in_stack_00000034);
  (in_RDI->fold).ins.field_0.ot = 0x5504;
  (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar2;
  (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar1;
  TVar1 = lj_opt_fold(in_RDI);
  *in_RDI->base = TVar1;
  return;
}

Assistant:

static void LJ_FASTCALL recff_bit_tohex(jit_State *J, RecordFFData *rd)
{
#if LJ_HASFFI
  TRef hdr = recff_bufhdr(J);
  TRef tr = recff_bit64_tohex(J, rd, hdr);
  J->base[0] = emitir(IRT(IR_BUFSTR, IRT_STR), tr, hdr);
#else
  recff_nyiu(J, rd);  /* Don't bother working around this NYI. */
#endif
}